

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::FindLSBCaseInstance::compare
          (FindLSBCaseInstance *this,void **inputs,void **outputs)

{
  uint value_00;
  bool bVar1;
  DataType dataType;
  Precision precision_00;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  int a;
  int b;
  reference pvVar5;
  ostream *poVar6;
  int maxRef;
  int minRef;
  int out;
  deUint32 value;
  int compNdx;
  deUint32 mask;
  int integerLength;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  FindLSBCaseInstance *this_local;
  
  pvVar5 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_IntegerFunctionTestInstance).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar5->varType);
  pvVar5 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_IntegerFunctionTestInstance).m_spec.inputs,0);
  precision_00 = glu::VarType::getPrecision(&pvVar5->varType);
  iVar2 = glu::getDataTypeScalarSize(dataType);
  iVar3 = shaderexecutor::anon_unknown_0::getShaderUintBitCount
                    ((this->super_IntegerFunctionTestInstance).m_shaderType,precision_00);
  dVar4 = shaderexecutor::anon_unknown_0::getLowBitMask(iVar3);
  out = 0;
  while( true ) {
    if (iVar2 <= out) {
      return true;
    }
    value_00 = *(uint *)((long)*inputs + (long)out * 4);
    iVar3 = *(int *)((long)*outputs + (long)out * 4);
    a = shaderexecutor::anon_unknown_0::findLSB(value_00 & dVar4);
    b = shaderexecutor::anon_unknown_0::findLSB(value_00);
    bVar1 = de::inRange<int>(iVar3,a,b);
    if (!bVar1) break;
    out = out + 1;
  }
  poVar6 = std::operator<<((ostream *)&(this->super_IntegerFunctionTestInstance).m_failMsg,
                           "Expected [");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,out);
  poVar6 = std::operator<<(poVar6,"] in range [");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,a);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,b);
  std::operator<<(poVar6,"]");
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const int*)outputs[0])[compNdx];
			const int		minRef	= findLSB(value&mask);
			const int		maxRef	= findLSB(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}